

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O1

int Res_WinCompute(Abc_Obj_t *pNode,int nWinTfiMax,int nWinTfoMax,Res_Win_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  void **ppvVar3;
  int iVar4;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x1c5,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
  }
  if (nWinTfiMax - 1U < 9) {
    if ((uint)nWinTfoMax < 10) {
      p->pNode = pNode;
      p->nWinTfiMax = nWinTfiMax;
      p->nWinTfoMax = nWinTfoMax;
      iVar4 = 0;
      p->vBranches->nSize = 0;
      p->vDivs->nSize = 0;
      pVVar1 = p->vRoots;
      pVVar1->nSize = 0;
      if (pVVar1->nCap == 0) {
        if (pVVar1->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(pVVar1->pArray,0x80);
        }
        pVVar1->pArray = ppvVar3;
        pVVar1->nCap = 0x10;
      }
      iVar2 = pVVar1->nSize;
      pVVar1->nSize = iVar2 + 1;
      pVVar1->pArray[iVar2] = pNode;
      iVar2 = Res_WinCollectLeavesAndNodes(p);
      if ((iVar2 != 0) && (iVar4 = 1, 0 < p->nWinTfoMax)) {
        iVar2 = Res_WinComputeRoots(p);
        if (iVar2 != 0) {
          Res_WinMarkPaths(p);
          iVar2 = Res_WinFinalizeRoots(p);
          if (iVar2 != 0) {
            Res_WinAddMissing(p);
          }
        }
      }
      return iVar4;
    }
    __assert_fail("nWinTfoMax >= 0 && nWinTfoMax < 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x1c7,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
  }
  __assert_fail("nWinTfiMax > 0 && nWinTfiMax < 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                ,0x1c6,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
}

Assistant:

int Res_WinCompute( Abc_Obj_t * pNode, int nWinTfiMax, int nWinTfoMax, Res_Win_t * p )
{
    assert( Abc_ObjIsNode(pNode) );
    assert( nWinTfiMax > 0 && nWinTfiMax < 10 );
    assert( nWinTfoMax >= 0 && nWinTfoMax < 10 );

    // initialize the window
    p->pNode      = pNode;
    p->nWinTfiMax = nWinTfiMax;
    p->nWinTfoMax = nWinTfoMax;

    Vec_PtrClear( p->vBranches );
    Vec_PtrClear( p->vDivs );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pNode );

    // compute the leaves
    if ( !Res_WinCollectLeavesAndNodes( p ) )
        return 0;

    // compute the candidate roots
    if ( p->nWinTfoMax > 0 && Res_WinComputeRoots(p) )
    {
        // mark the paths from the roots to the leaves
        Res_WinMarkPaths( p );
        // refine the roots and add branches and missing nodes
        if ( Res_WinFinalizeRoots( p ) )
            Res_WinAddMissing( p );
    }

    return 1;
}